

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O2

int dynet::rand0n(int n)

{
  runtime_error *this;
  float fVar1;
  
  if (0 < n) {
    fVar1 = rand01();
    while ((int)(fVar1 * (float)n) == n) {
      fVar1 = rand01();
    }
    return (int)(fVar1 * (float)n);
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Integer upper bound is non-positive");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int rand0n(int n) {
  if (n <= 0) throw std::runtime_error("Integer upper bound is non-positive");
  int x = rand01() * n;
  while (n == x) { x = rand01() * n; }
  return x;
}